

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiDisplayTimingTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::wsi::anon_unknown_0::DisplayTimingTestInstance::iterate
          (TestStatus *__return_storage_ptr__,DisplayTimingTestInstance *this)

{
  VkExtent2D *pVVar1;
  DeviceDriver *pDVar2;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_> *__x;
  vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_> *pvVar3;
  deUint64 *pdVar4;
  VkFormat VVar5;
  float fVar6;
  uint uVar7;
  VkSwapchainKHR obj;
  VkRenderPass obj_00;
  VkPipeline obj_01;
  VkDevice pVVar8;
  VkPipelineShaderStageCreateInfo *pVVar9;
  pointer pHVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  pointer ppVVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  deUint64 dVar15;
  size_t sVar16;
  VkDevice_s *pVVar17;
  long lVar18;
  ulong uVar19;
  vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_> *pvVar20;
  pointer pHVar21;
  pointer pcVar22;
  VkExtent2D VVar23;
  _Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
  *p_Var24;
  TestStatus *pTVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  VkDevice pVVar28;
  VkPipelineShaderStageCreateInfo *pVVar29;
  VkCommandPool VVar30;
  VkImage VVar31;
  VkResult VVar32;
  deUint32 dVar33;
  qpTestResult qVar34;
  mapped_type_conflict1 *pmVar35;
  long *plVar36;
  undefined8 uVar37;
  vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *pvVar38;
  deUint64 dVar39;
  bool bVar40;
  VkDevice *ppVVar41;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar42;
  mapped_type_conflict1 mVar43;
  ulong uVar44;
  long lVar45;
  VkPipelineRasterizationStateCreateInfo rasterizationState;
  VkPipelineDepthStencilStateCreateInfo depthStencilState;
  VkAttachmentDescription attachments [1];
  deUint32 numPastPresentationTimings;
  VkSampleMask sampleMask;
  VkCommandBufferAllocateInfo allocateInfo;
  VkPipelineMultisampleStateCreateInfo multisampleState;
  VkAttachmentReference colorAttachmentRefs [1];
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkPipelineViewportStateCreateInfo viewportState;
  VkRect2D scissors [1];
  VkViewport viewports [1];
  VkPipelineDynamicStateCreateInfo dynamicState;
  VkPipelineColorBlendAttachmentState attachmentBlendState;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  VkSpecializationInfo shaderSpecialization;
  undefined1 local_698 [16];
  pointer local_688;
  VkPipelineShaderStageCreateInfo *pVStack_680;
  undefined8 local_678;
  VkVertexInputAttributeDescription *pVStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *local_658;
  TestStatus *local_650;
  vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
  *local_648;
  ResultCollector *local_640;
  undefined1 local_638 [16];
  VkDevice local_628;
  VkPipelineShaderStageCreateInfo *pVStack_620;
  undefined8 local_618;
  VkSubpassDescription *pVStack_610;
  undefined8 local_608;
  VkSubpassDependency *pVStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined1 local_5c8 [16];
  VkDevice pVStack_5b8;
  VkCommandPool VStack_5b0;
  PFN_vkInternalAllocationNotification local_5a8;
  PFN_vkInternalFreeNotification local_5a0;
  undefined4 local_598;
  undefined8 local_590;
  undefined8 local_588;
  deUint64 local_580;
  char *local_578;
  PFN_vkInternalFreeNotification local_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_560;
  undefined1 local_558 [8];
  pointer pHStack_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_548;
  _Base_ptr local_538;
  VkExtent2D VStack_530;
  undefined4 local_528;
  undefined1 *local_520;
  ios_base local_4e0 [296];
  Move<vk::Handle<(vk::HandleType)18>_> local_3b8;
  vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_> *local_398;
  VkSampleMask local_38c;
  undefined1 local_388 [16];
  VkCommandPool local_378;
  VkImage VStack_370;
  undefined8 local_368;
  VkPipelineInputAssemblyStateCreateInfo *pVStack_360;
  VkExtent2D local_358;
  VkPipelineVertexInputStateCreateInfo *pVStack_350;
  VkPipelineRasterizationStateCreateInfo *local_348;
  VkPipelineMultisampleStateCreateInfo *local_340;
  VkPipelineDepthStencilStateCreateInfo *local_338;
  VkPipelineColorBlendStateCreateInfo *local_330;
  VkPipelineDynamicStateCreateInfo *local_328;
  VkPipelineLayout local_320;
  VkRenderPass local_318;
  deUint32 local_310;
  VkPipeline local_308;
  deInt32 local_300;
  VkPipelineMultisampleStateCreateInfo local_1b0;
  VkFence local_180;
  void *local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  VkPipelineColorBlendAttachmentState *local_160;
  float local_158 [4];
  VkPipelineShaderStageCreateInfo local_148;
  Handle<(vk::HandleType)4> local_118;
  void *local_110;
  undefined8 local_108;
  undefined8 *local_100;
  VkCullModeFlags local_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  float local_e0;
  uint local_dc;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  undefined8 local_c8;
  VkPipelineDynamicStateCreateInfo local_b8;
  VkPipelineColorBlendAttachmentState local_98;
  VkPipelineInputAssemblyStateCreateInfo local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_650 = __return_storage_ptr__;
  if (this->m_frameNdx == 0) {
    if (this->m_outOfDateCount == 0) {
      local_558 = (undefined1  [8])((this->super_TestInstance).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550,"Swapchain: ",0xb);
      ::vk::operator<<((ostream *)&pHStack_550,&this->m_swapchainConfig);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
      std::ios_base::~ios_base(local_4e0);
    }
    VVar5 = (this->m_swapchainConfig).imageFormat;
    pVVar1 = &(this->m_swapchainConfig).imageExtent;
    fVar6 = (float)pVVar1->width;
    uVar7 = (this->m_swapchainConfig).imageExtent.height;
    VVar23 = *pVVar1;
    pDVar2 = &this->m_vkd;
    ::vk::createSwapchainKHR
              ((Move<vk::Handle<(vk::HandleType)26>_> *)local_638,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               &this->m_swapchainConfig,(VkAllocationCallbacks *)0x0);
    local_378.m_internal = (deUint64)local_628;
    VStack_370.m_internal = (deUint64)pVStack_620;
    local_388._0_8_ = local_638._0_8_;
    local_388._8_8_ = local_638._8_8_;
    local_638._0_8_ = 0;
    local_638._8_8_ = (DeviceInterface *)0x0;
    local_628 = (VkDevice)0x0;
    pVStack_620 = (VkPipelineShaderStageCreateInfo *)0x0;
    obj.m_internal =
         (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal
    ;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                (&(this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter,
                 obj);
    }
    (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_device =
         (VkDevice)local_378.m_internal;
    (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_370.m_internal;
    (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.m_internal =
         local_388._0_8_;
    (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)local_388._8_8_;
    if (local_638._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)26>_> *)(local_638 + 8),
                 (VkSwapchainKHR)local_638._0_8_);
    }
    ::vk::wsi::getSwapchainImages
              ((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)local_388,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkSwapchainKHR)
               (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
               m_internal);
    local_640 = (ResultCollector *)&this->m_swapchainImages;
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    _M_move_assign((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                    *)local_640,(VkSubpassDescription *)local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_378.m_internal - local_388._0_8_);
    }
    local_5c8._0_8_ = (ulong)VVar5 << 0x20;
    local_5c8._8_8_ = &DAT_00000001;
    pVStack_5b8 = (VkDevice)0x200000000;
    VStack_5b0.m_internal = 0x200000001;
    local_5a8 = (PFN_vkInternalAllocationNotification)CONCAT44(local_5a8._4_4_,0x3b9acdea);
    local_180.m_internal = 0x200000000;
    local_378.m_internal = 0;
    pVStack_360 = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
    local_348 = (VkPipelineRasterizationStateCreateInfo *)0x0;
    local_358 = (VkExtent2D)0x0;
    pVStack_350 = (VkPipelineVertexInputStateCreateInfo *)0x0;
    local_388._0_8_ = (pointer)0x0;
    local_388._8_8_ = (DeviceInterface *)0x0;
    VStack_370.m_internal = (deUint64)&DAT_00000001;
    local_638._0_4_ = 0x26;
    local_638._8_8_ = (DeviceInterface *)0x0;
    local_628 = (VkDevice)0x100000000;
    local_618._0_4_ = 1;
    local_608 = (ulong)local_608._4_4_ << 0x20;
    pVStack_600 = (VkSubpassDependency *)0x0;
    pVStack_620 = (VkPipelineShaderStageCreateInfo *)local_5c8;
    pVStack_610 = (VkSubpassDescription *)local_388;
    local_368 = (VkPipelineColorBlendStateCreateInfo *)&local_180;
    ::vk::createRenderPass
              ((Move<vk::Handle<(vk::HandleType)17>_> *)local_698,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkRenderPassCreateInfo *)local_638,(VkAllocationCallbacks *)0x0);
    local_378.m_internal = (deUint64)local_688;
    VStack_370.m_internal = (deUint64)pVStack_680;
    local_388._0_8_ = local_698._0_8_;
    local_388._8_8_ = local_698._8_8_;
    local_698._0_8_ = 0;
    local_698._8_8_ = (pointer)0x0;
    local_688 = (pointer)0x0;
    pVStack_680 = (VkPipelineShaderStageCreateInfo *)0x0;
    obj_00.m_internal =
         (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
         m_internal;
    if (obj_00.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter
                 ,obj_00);
    }
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)local_378.m_internal;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_370.m_internal;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         local_388._0_8_;
    (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)local_388._8_8_;
    if (local_698._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(local_698 + 8),
                 (VkRenderPass)local_698._0_8_);
    }
    local_318.m_internal =
         (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
         m_internal;
    local_320.m_internal =
         (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
         m_internal;
    VStack_5b0.m_internal =
         (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
         m_internal;
    local_580 = (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
                .object.m_internal;
    local_5a0 = (PFN_vkInternalFreeNotification)&local_58;
    local_5c8._0_4_ = 0x12;
    local_5c8._8_8_ = (DeviceInterface *)0x0;
    pVStack_5b8 = (VkDevice)0x100000000;
    local_5a8 = (PFN_vkInternalAllocationNotification)0xaed455;
    local_598 = 0x12;
    local_590 = 0;
    local_588 = 0x1000000000;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_578 = "main";
    local_100 = &local_d8;
    local_d8 = 0;
    local_d0 = (float)(uint)fVar6;
    local_cc = (float)uVar7;
    local_c8 = 0x3f80000000000000;
    local_f0 = &local_e8;
    local_e8._0_4_ = 0.0;
    local_e8._4_4_ = 0.0;
    pVStack_350 = (VkPipelineVertexInputStateCreateInfo *)&local_118;
    local_118.m_internal._0_4_ = 0x16;
    local_110 = (void *)0x0;
    local_108._0_4_ = 0;
    local_108._4_4_ = 1;
    local_f8 = 1;
    local_698._8_8_ = (pointer)0x0;
    pVStack_680 = (VkPipelineShaderStageCreateInfo *)0x0;
    pVStack_670 = (VkVertexInputAttributeDescription *)0x0;
    local_668._0_4_ = 0.0;
    local_668._4_4_ = 0.0;
    local_698._0_8_ = &DAT_00000026;
    local_688 = (pointer)0x100000000;
    local_678._0_4_ = 0;
    local_678._4_4_ = VK_FRONT_FACE_CLOCKWISE;
    local_1b0.pSampleMask = &local_38c;
    local_38c = 0xffffffff;
    local_340 = &local_1b0;
    local_1b0.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
    local_1b0.pNext = (void *)0x0;
    local_1b0.flags = 0;
    local_1b0.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
    local_1b0.sampleShadingEnable = 0;
    local_1b0.minSampleShading = 0.0;
    local_638._8_8_ = (DeviceInterface *)0x0;
    local_628 = (VkDevice)0x0;
    pVStack_600 = (VkSubpassDependency *)0x0;
    uStack_5e0 = 0;
    local_5f8 = 0;
    uStack_5f0 = 0;
    local_618._0_4_ = 0;
    local_618._4_4_ = 0;
    pVStack_610 = (VkSubpassDescription *)0x0;
    local_638._0_8_ = 0x19;
    pVStack_620 = (VkPipelineShaderStageCreateInfo *)0x700000000;
    local_608._0_4_ = 0;
    local_608._4_4_ = 7;
    local_5e8 = 7;
    uStack_660._0_4_ = 1.0;
    uStack_660._4_4_ = 0;
    local_5d8 = 0x3f80000000000000;
    local_180.m_internal._0_4_ = 0x1a;
    local_178 = (void *)0x0;
    uStack_170 = 0;
    local_168 = 0x100000003;
    local_160 = &local_98;
    local_98.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
    local_98.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
    local_98.alphaBlendOp = VK_BLEND_OP_ADD;
    local_98.colorWriteMask = 0xf;
    local_98.blendEnable = 0;
    local_98.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
    local_98.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
    local_98.colorBlendOp = VK_BLEND_OP_ADD;
    local_388._0_4_ = 0x1c;
    local_388._8_8_ = (DeviceInterface *)0x0;
    local_378.m_internal = 0x200000000;
    local_368 = (VkPipelineColorBlendStateCreateInfo *)&local_148;
    local_148.pNext = (void *)0x0;
    local_148.pName = (char *)0x0;
    local_148.pSpecializationInfo = (VkSpecializationInfo *)0x0;
    local_148.flags = 0;
    local_148.stage = 0;
    local_148.module.m_internal = 0;
    local_148.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    local_148._4_4_ = 0;
    pVStack_360 = &local_78;
    local_78.flags = 0;
    local_78.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    local_78.primitiveRestartEnable = 0;
    local_78._28_4_ = 0;
    local_78.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
    local_78._4_4_ = 0;
    local_78.pNext = (void *)0x0;
    local_358.width = 0;
    local_358.height = 0;
    local_1b0.alphaToCoverageEnable = 0;
    local_1b0.alphaToOneEnable = 0;
    local_348 = (VkPipelineRasterizationStateCreateInfo *)local_698;
    local_328 = &local_b8;
    local_b8.flags = 0;
    local_b8.dynamicStateCount = 0;
    local_b8.pDynamicStates = (VkDynamicState *)0x0;
    local_b8.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
    local_b8._4_4_ = 0;
    local_b8.pNext = (void *)0x0;
    local_310 = 0;
    local_308.m_internal = 0;
    local_300 = 0;
    local_158[0] = 0.0;
    local_158[1] = 0.0;
    local_158[2] = 0.0;
    local_158[3] = 0.0;
    local_570 = local_5a0;
    VStack_370.m_internal = (deUint64)local_5c8;
    local_338 = (VkPipelineDepthStencilStateCreateInfo *)local_638;
    local_330 = (VkPipelineColorBlendStateCreateInfo *)&local_180;
    local_e0 = fVar6;
    local_dc = uVar7;
    ::vk::createGraphicsPipeline
              (&local_3b8,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,(VkPipelineCache)0x0,
               (VkGraphicsPipelineCreateInfo *)local_388,(VkAllocationCallbacks *)0x0);
    local_378.m_internal =
         (deUint64)local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
    VStack_370.m_internal =
         (deUint64)
         local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
    local_388._0_8_ =
         local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    local_388._8_8_ =
         local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
    local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0
    ;
    local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
    local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    obj_01.m_internal =
         (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
    if (obj_01.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 obj_01);
    }
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)local_378.m_internal;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VStack_370.m_internal;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
         local_388._0_8_;
    (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)local_388._8_8_;
    if (local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_3b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
    local_638._0_8_ = 0;
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            *)local_388,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_638,
           (allocator_type *)local_5c8);
    __x = &this->m_swapchainImageViews;
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    _M_move_assign(__x,local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_378.m_internal - local_388._0_8_);
    }
    local_638._0_8_ = 0;
    std::vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
            *)local_388,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_638,
           (allocator_type *)local_5c8);
    local_648 = &this->m_framebuffers;
    std::vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>::
    _M_move_assign(local_648,local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_378.m_internal - local_388._0_8_);
    }
    local_638._0_8_ = 0;
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *
           )local_388,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_638,
           (allocator_type *)local_5c8);
    local_658 = &this->m_acquireSemaphores;
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    _M_move_assign(local_658,local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_378.m_internal - local_388._0_8_);
    }
    local_638._0_8_ = 0;
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_> *
           )local_388,
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_swapchainImages).
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_638,
           (allocator_type *)local_5c8);
    local_560 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&this->m_renderSemaphores;
    std::vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>::
    _M_move_assign((vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                    *)local_560,local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_378.m_internal - local_388._0_8_);
    }
    local_388._0_8_ = (pointer)0x0;
    local_388._8_8_ = (DeviceInterface *)0x0;
    local_378.m_internal = 0;
    local_388._0_8_ = operator_new(0x30);
    local_388._8_8_ = local_388._0_8_ + 0x30;
    ((pointer)(local_388._0_8_ + 0x20))->m_internal = 0;
    ((pointer)(local_388._0_8_ + 0x28))->m_internal = 0;
    ((pointer)(local_388._0_8_ + 0x10))->m_internal = 0;
    ((pointer)(local_388._0_8_ + 0x18))->m_internal = 0;
    ((pointer)local_388._0_8_)->m_internal = 0;
    ((pointer)(local_388._0_8_ + 8))->m_internal = 0;
    pvVar3 = &this->m_fences;
    local_378.m_internal = local_388._8_8_;
    std::vector<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>::
    _M_move_assign(pvVar3,local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_378.m_internal - local_388._0_8_);
    }
    local_638._0_8_ = (void *)0x0;
    std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::vector
              ((vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_> *)
               local_388,
               (long)(this->m_fences).
                     super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_fences).
                     super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_638,
               (allocator_type *)local_5c8);
    std::vector<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>::_M_move_assign
              (&this->m_commandBuffers,local_388);
    if ((pointer)local_388._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_388._0_8_,local_378.m_internal - local_388._0_8_);
    }
    (this->m_freeAcquireSemaphore).m_internal = 0;
    (this->m_freeRenderSemaphore).m_internal = 0;
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)local_388,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
               (VkAllocationCallbacks *)0x0);
    uVar37 = local_388._0_8_;
    local_378.m_internal = 0;
    VStack_370.m_internal = 0;
    local_388._0_8_ = (pointer)0x0;
    local_388._8_8_ = (DeviceInterface *)0x0;
    (this->m_freeAcquireSemaphore).m_internal = uVar37;
    ::vk::createSemaphore
              ((Move<vk::Handle<(vk::HandleType)4>_> *)local_388,&pDVar2->super_DeviceInterface,
               (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,0,
               (VkAllocationCallbacks *)0x0);
    uVar37 = local_388._0_8_;
    local_378.m_internal = 0;
    VStack_370.m_internal = 0;
    local_388._0_8_ = (pointer)0x0;
    local_388._8_8_ = (DeviceInterface *)0x0;
    (this->m_freeRenderSemaphore).m_internal = uVar37;
    local_398 = pvVar3;
    if ((this->m_swapchainImageViews).
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_swapchainImageViews).
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pVVar8 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
      uVar44 = 0;
      uVar37 = local_638._0_8_;
      uVar27 = local_638._8_8_;
      pVVar28 = local_628;
      pVVar9 = pVStack_620;
      do {
        pVStack_620 = pVVar9;
        local_628 = pVVar28;
        local_638._8_8_ = uVar27;
        local_638._0_8_ = uVar37;
        VStack_370.m_internal =
             (((_Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                *)&local_640->m_log)->_M_impl).super__Vector_impl_data._M_start[uVar44].m_internal;
        local_388._0_4_ = 0xf;
        local_388._8_8_ = (DeviceInterface *)0x0;
        local_378.m_internal = local_378.m_internal & 0xffffffff00000000;
        local_368 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(VVar5,1);
        pVStack_360 = (VkPipelineInputAssemblyStateCreateInfo *)0x400000003;
        local_358.width = 5;
        local_358.height = 6;
        pVStack_350 = (VkPipelineVertexInputStateCreateInfo *)&DAT_00000001;
        local_348 = (VkPipelineRasterizationStateCreateInfo *)&DAT_00000001;
        local_340 = (VkPipelineMultisampleStateCreateInfo *)CONCAT44(local_340._4_4_,1);
        ::vk::createImageView
                  ((Move<vk::Handle<(vk::HandleType)13>_> *)local_638,&pDVar2->super_DeviceInterface
                   ,pVVar8,(VkImageViewCreateInfo *)local_388,(VkAllocationCallbacks *)0x0);
        uVar26 = local_638._0_8_;
        local_638._0_8_ = (void *)0x0;
        uVar37 = local_638._0_8_;
        local_638._8_8_ = (DeviceInterface *)0x0;
        uVar27 = local_638._8_8_;
        local_628 = (VkDevice)0x0;
        pVVar28 = local_628;
        pVStack_620 = (VkPipelineShaderStageCreateInfo *)0x0;
        pVVar9 = pVStack_620;
        (__x->
        super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar44].m_internal = uVar26;
        pVStack_620 = (VkPipelineShaderStageCreateInfo *)0x0;
        local_628 = (VkDevice)0x0;
        local_638._8_8_ = (DeviceInterface *)0x0;
        local_638._0_8_ = (void *)0x0;
        uVar44 = uVar44 + 1;
      } while (uVar44 < (ulong)((long)(this->m_swapchainImageViews).
                                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_swapchainImageViews).
                                      super__Vector_base<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pVVar8 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
    pVVar9 = (VkPipelineShaderStageCreateInfo *)
             (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
             m_internal;
    std::vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
    vector((vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
            *)local_5c8,__x);
    if ((this->m_framebuffers).
        super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_framebuffers).
        super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar44 = 0;
      uVar37 = local_638._0_8_;
      uVar27 = local_638._8_8_;
      pVVar28 = local_628;
      pVVar29 = pVStack_620;
      do {
        pVStack_620 = pVVar29;
        local_628 = pVVar28;
        local_638._8_8_ = uVar27;
        local_638._0_8_ = uVar37;
        local_698._0_8_ = *(undefined8 *)(local_5c8._0_8_ + uVar44 * 8);
        local_388._0_4_ = 0x25;
        local_388._8_8_ = (DeviceInterface *)0x0;
        local_378.m_internal = local_378.m_internal & 0xffffffff00000000;
        local_368 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(local_368._4_4_,1);
        pVStack_360 = (VkPipelineInputAssemblyStateCreateInfo *)local_698;
        pVStack_350 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(pVStack_350._4_4_,1);
        VStack_370.m_internal = (deUint64)pVVar9;
        local_358 = VVar23;
        ::vk::createFramebuffer
                  ((Move<vk::Handle<(vk::HandleType)23>_> *)local_638,&pDVar2->super_DeviceInterface
                   ,pVVar8,(VkFramebufferCreateInfo *)local_388,(VkAllocationCallbacks *)0x0);
        uVar26 = local_638._0_8_;
        local_638._0_8_ = (void *)0x0;
        uVar37 = local_638._0_8_;
        local_638._8_8_ = (DeviceInterface *)0x0;
        uVar27 = local_638._8_8_;
        local_628 = (VkDevice)0x0;
        pVVar28 = local_628;
        pVStack_620 = (VkPipelineShaderStageCreateInfo *)0x0;
        pVVar29 = pVStack_620;
        (local_648->
        super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar44].m_internal = uVar26;
        pVStack_620 = (VkPipelineShaderStageCreateInfo *)0x0;
        local_628 = (VkDevice)0x0;
        local_638._8_8_ = (DeviceInterface *)0x0;
        local_638._0_8_ = (void *)0x0;
        uVar44 = uVar44 + 1;
      } while (uVar44 < (ulong)((long)(this->m_framebuffers).
                                      super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_framebuffers).
                                      super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((VkCommandBuffer_s *)local_5c8._0_8_ != (VkCommandBuffer_s *)0x0) {
      operator_delete((void *)local_5c8._0_8_,(long)pVStack_5b8 - local_5c8._0_8_);
    }
    initSemaphores(&pDVar2->super_DeviceInterface,
                   (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,local_658);
    pvVar3 = local_398;
    initSemaphores(&pDVar2->super_DeviceInterface,
                   (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   (vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                    *)local_560);
    if ((this->m_fences).
        super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_fences).
        super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pVVar8 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
      uVar44 = 0;
      uVar37 = local_388._0_8_;
      uVar27 = local_388._8_8_;
      VVar30.m_internal = local_378.m_internal;
      VVar31.m_internal = VStack_370.m_internal;
      do {
        VStack_370.m_internal = VVar31.m_internal;
        local_378.m_internal = VVar30.m_internal;
        local_388._8_8_ = uVar27;
        local_388._0_8_ = uVar37;
        ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_388,
                          &pDVar2->super_DeviceInterface,pVVar8,0,(VkAllocationCallbacks *)0x0);
        uVar26 = local_388._0_8_;
        local_378.m_internal = 0;
        VVar30.m_internal = local_378.m_internal;
        VStack_370.m_internal = 0;
        VVar31.m_internal = VStack_370.m_internal;
        local_388._0_8_ = (pointer)0x0;
        uVar37 = local_388._0_8_;
        local_388._8_8_ = (DeviceInterface *)0x0;
        uVar27 = local_388._8_8_;
        (pvVar3->
        super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
        )._M_impl.super__Vector_impl_data._M_start[uVar44].m_internal = uVar26;
        VStack_370.m_internal = 0;
        local_378.m_internal = 0;
        local_388._8_8_ = (DeviceInterface *)0x0;
        local_388._0_8_ = (pointer)0x0;
        uVar44 = uVar44 + 1;
      } while (uVar44 < (ulong)((long)(this->m_fences).
                                      super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_fences).
                                      super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (this->m_useDisplayTiming == true) {
      local_548._M_allocated_capacity = 0;
      local_558 = (undefined1  [8])0x0;
      pHStack_550 = (pointer)0x0;
      VStack_530.width = 0;
      VStack_530.height = 0;
      local_548._8_8_ = (_Base_ptr)&pHStack_550;
      local_538 = (_Base_ptr)&pHStack_550;
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::clear(&(this->m_queuePresentTimes)._M_t);
      if ((_Base_ptr)local_548._M_allocated_capacity != (_Base_ptr)0x0) {
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)pHStack_550;
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)local_548._M_allocated_capacity;
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)local_548._8_8_;
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_538;
        *(_Rb_tree_header **)(local_548._M_allocated_capacity + 8) =
             &(this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header;
        (this->m_queuePresentTimes)._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)VStack_530;
        local_548._M_allocated_capacity = 0;
        VStack_530.width = 0;
        VStack_530.height = 0;
        local_548._8_8_ = (_Base_ptr)&pHStack_550;
        local_538 = (_Base_ptr)&pHStack_550;
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                   *)local_558);
      ::vk::DeviceDriver::getRefreshCycleDurationGOOGLE
                (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                 (VkSwapchainKHR)
                 (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
                 m_internal,&this->m_rcDuration);
      this->m_refreshDurationMultiplier = 1;
      this->m_targetIPD = (this->m_rcDuration).refreshDuration;
      this->m_prevDesiredPresentTime = 0;
      this->m_nextPresentID = 0;
      this->m_ignoreThruPresentID = 0;
    }
  }
  pHVar10 = (this->m_fences).
            super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar44 = (long)(this->m_fences).
                 super__Vector_base<vk::Handle<(vk::HandleType)6>,_std::allocator<vk::Handle<(vk::HandleType)6>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar10 >> 3;
  local_180.m_internal = pHVar10[this->m_frameNdx % uVar44].m_internal;
  VVar23 = (this->m_swapchainConfig).imageExtent;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  if (uVar44 <= this->m_frameNdx) {
    pDVar2 = &this->m_vkd;
    VVar32 = ::vk::DeviceDriver::waitForFences
                       (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                        &local_180,1,0xffffffffffffffff);
    ::vk::checkResult(VVar32,"m_vkd.waitForFences(*m_device, 1u, &fence, VK_TRUE, foreverNs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x43d);
    VVar32 = ::vk::DeviceDriver::resetFences
                       (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,1,
                        &local_180);
    ::vk::checkResult(VVar32,"m_vkd.resetFences(*m_device, 1u, &fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x43e);
    ppVVar12 = (this->m_commandBuffers).
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ::vk::DeviceDriver::freeCommandBuffers
              (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
               (VkCommandPool)
               (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
               m_internal,1,
               ppVVar12 +
               this->m_frameNdx %
               (ulong)((long)(this->m_commandBuffers).
                             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12 >> 3));
    ppVVar12 = (this->m_commandBuffers).
               super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppVVar12[this->m_frameNdx %
             (ulong)((long)(this->m_commandBuffers).
                           super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12 >> 3)] =
         (VkCommandBuffer_s *)0x0;
  }
  local_148._0_8_ = (this->m_freeAcquireSemaphore).m_internal;
  local_118.m_internal = (this->m_freeRenderSemaphore).m_internal;
  pDVar2 = &this->m_vkd;
  VVar32 = ::vk::DeviceDriver::acquireNextImageKHR
                     (pDVar2,(this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                      (VkSwapchainKHR)
                      (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.
                      object.m_internal,0xffffffffffffffff,(VkSemaphore)local_148._0_8_,local_180,
                      &local_1b0.sType);
  ::vk::checkResult(VVar32,
                    "m_vkd.acquireNextImageKHR(*m_device, *m_swapchain, foreverNs, currentAcquireSemaphore, fence, &imageIndex)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x449);
  local_378.m_internal =
       (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
  ;
  dVar39 = (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
           m_internal;
  p_Var13 = (_Base_ptr)
            (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
            m_internal;
  p_Var14 = (_Base_ptr)
            (this->m_framebuffers).
            super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_1b0.sType].m_internal;
  dVar15 = (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.
           m_internal;
  sVar16 = this->m_frameNdx;
  dVar33 = this->m_quadCount;
  local_388._0_4_ = 0x28;
  local_388._8_8_ = (DeviceInterface *)0x0;
  VStack_370.m_internal = 0x100000000;
  local_628 = (VkDevice)0x0;
  pVStack_620 = (VkPipelineShaderStageCreateInfo *)0x0;
  local_638._0_8_ = (VkDevice *)0x2a;
  local_638._8_8_ = (DeviceInterface *)0x0;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_5c8,&pDVar2->super_DeviceInterface,
             (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
             (VkCommandBufferAllocateInfo *)local_388);
  VVar32 = (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x49])
                     (pDVar2,local_5c8._0_8_,local_638);
  ::vk::checkResult(VVar32,"vkd.beginCommandBuffer(*commandBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x12f);
  local_698._0_8_ = 0x3f0000003e800000;
  local_698._8_8_ = (pointer)0x3f8000003f400000;
  local_558._0_4_ = 0x2b;
  pHStack_550 = (pointer)0x0;
  local_538 = (_Base_ptr)0x0;
  local_528 = 1;
  local_548._M_allocated_capacity = (size_type)p_Var13;
  local_548._8_8_ = p_Var14;
  VStack_530 = VVar23;
  local_520 = local_698;
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x74])(pDVar2,local_5c8._0_8_,local_558,0)
  ;
  uVar37 = local_5c8._0_8_;
  local_698._0_4_ = (int)sVar16;
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x73])
            (pDVar2,local_5c8._0_8_,dVar39,0x10,0,4,local_698);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x4c])(pDVar2,uVar37,0,dVar15);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x59])
            (pDVar2,uVar37,(ulong)(dVar33 * 6),1,0,0);
  (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x76])(pDVar2,local_5c8._0_8_);
  VVar32 = (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x4a])(pDVar2,local_5c8._0_8_);
  ::vk::checkResult(VVar32,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x149);
  ppVVar12 = (this->m_commandBuffers).
             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppVVar12[this->m_frameNdx %
           (ulong)((long)(this->m_commandBuffers).
                         super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12 >> 3)] =
       (VkCommandBuffer_s *)local_5c8._0_8_;
  VStack_5b0.m_internal = 0;
  pVStack_5b8 = (VkDevice)0x0;
  local_5c8._8_8_ = (DeviceInterface *)0x0;
  local_5c8._0_8_ = (VkCommandBuffer_s *)0x0;
  if (this->m_useDisplayTiming != true) goto LAB_00741b21;
  pVVar17 = (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  dVar39 = (this->m_swapchain).super_RefBase<vk::Handle<(vk::HandleType)26>_>.m_data.object.
           m_internal;
  local_698._0_8_ = (void *)0x0;
  local_698._8_8_ = (pointer)0x0;
  local_688 = (pointer)0x0;
  local_558 = (undefined1  [8])((ulong)local_558 & 0xffffffff00000000);
  (*(this->m_vkd).super_DeviceInterface._vptr_DeviceInterface[0x95])
            (pDVar2,pVVar17,dVar39,local_558,0);
  std::
  vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>::
  resize((vector<vk::VkPastPresentationTimingGOOGLE,_std::allocator<vk::VkPastPresentationTimingGOOGLE>_>
          *)local_698,(ulong)local_558 & 0xffffffff);
  if (local_558._0_4_ != 0) {
    (*(pDVar2->super_DeviceInterface)._vptr_DeviceInterface[0x95])
              (pDVar2,pVVar17,dVar39,local_558,local_698._0_8_);
  }
  if (local_698._8_8_ == local_698._0_8_) {
    bVar40 = false;
    pvVar38 = (vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
               *)0x0;
  }
  else {
    local_640 = &this->m_resultCollector;
    lVar45 = 0;
    uVar44 = 0;
    bVar40 = false;
    local_658 = (vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                 *)0x0;
    do {
      pmVar35 = std::
                map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                ::operator[](&this->m_queuePresentTimes,(key_type *)(local_698._0_8_ + lVar45));
      if (*(ulong *)(local_698._0_8_ + 0x10 + lVar45) < *pmVar35) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_388);
        std::ostream::_M_insert<unsigned_long>((ulong)local_388);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_388);
        std::ios_base::~ios_base((ios_base *)&local_318);
        plVar36 = (long *)std::__cxx11::string::replace((ulong)local_5c8,0,(char *)0x0,0xb3b0ab);
        local_638._0_8_ = &local_628;
        ppVVar41 = (VkDevice *)(plVar36 + 2);
        if ((VkDevice *)*plVar36 == ppVVar41) {
          local_628 = *ppVVar41;
          pVStack_620 = (VkPipelineShaderStageCreateInfo *)plVar36[3];
        }
        else {
          local_628 = *ppVVar41;
          local_638._0_8_ = (VkDevice *)*plVar36;
        }
        local_638._8_8_ = plVar36[1];
        *plVar36 = (long)ppVVar41;
        plVar36[1] = 0;
        *(undefined1 *)(plVar36 + 2) = 0;
        plVar36 = (long *)std::__cxx11::string::append(local_638);
        local_558 = (undefined1  [8])&local_548;
        paVar42 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar36 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar36 == paVar42) {
          local_548._M_allocated_capacity = paVar42->_M_allocated_capacity;
          local_548._8_8_ = plVar36[3];
        }
        else {
          local_548._M_allocated_capacity = paVar42->_M_allocated_capacity;
          local_558 = (undefined1  [8])*plVar36;
        }
        pHStack_550 = (pointer)plVar36[1];
        *plVar36 = (long)paVar42;
        plVar36[1] = 0;
        *(undefined1 *)(plVar36 + 2) = 0;
        tcu::ResultCollector::fail(local_640,(string *)local_558);
        if (local_558 != (undefined1  [8])&local_548) {
          operator_delete((void *)local_558,(ulong)(local_548._M_allocated_capacity + 1));
        }
        if ((VkDevice *)local_638._0_8_ != &local_628) {
          operator_delete((void *)local_638._0_8_,(ulong)(local_628 + 1));
        }
        if ((VkCommandBuffer_s *)local_5c8._0_8_ != (VkCommandBuffer_s *)&pVStack_5b8) {
          operator_delete((void *)local_5c8._0_8_,(ulong)(pVStack_5b8 + 1));
        }
      }
      if (this->m_ignoreThruPresentID == 0) {
        this->m_prevDesiredPresentTime =
             (ulong)(this->m_nextPresentID - ((pointer)(local_698._8_8_ + -0x28))->presentID) *
             this->m_targetIPD + ((pointer)(local_698._8_8_ + -0x28))->actualPresentTime;
        this->m_ignoreThruPresentID = *(int *)(local_698._0_8_ + lVar45) + 1;
      }
      else if (this->m_ignoreThruPresentID < *(uint *)(local_698._0_8_ + lVar45)) {
        lVar18 = *(long *)(local_698._0_8_ + 8 + lVar45);
        uVar19 = *(ulong *)(local_698._0_8_ + 0x10 + lVar45);
        pvVar20 = (vector<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
                   *)(this->m_rcDuration).refreshDuration;
        if ((ulong)((long)(pvVar20 + 0xa2c2) + 0x10 + lVar18) < uVar19) {
          local_648 = pvVar20;
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"Image PresentID ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," was ",5);
          p_Var24 = &local_648->
                     super__Vector_base<vk::Handle<(vk::HandleType)23>,_std::allocator<vk::Handle<(vk::HandleType)23>_>_>
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550," nsec late.",0xb);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          if ((this->m_ExpectImage80Late == true) && (*(int *)(local_698._0_8_ + lVar45) == 0x50)) {
            if (uVar19 - ((long)&(p_Var24->_M_impl).super__Vector_impl_data._M_start + lVar18) <
                0x1dcd6501) {
              local_558 = (undefined1  [8])&local_548;
              local_388._0_8_ = (pointer)0x47;
              local_560 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)std::__cxx11::string::_M_create((ulong *)local_558,(ulong)local_388);
              uVar37 = local_388._0_8_;
              local_548._M_allocated_capacity = local_388._0_8_;
              local_558 = (undefined1  [8])local_560;
              memcpy(local_560,
                     "Image PresentID 80 was not late by approximately 1 second, as expected.",0x47)
              ;
              pHStack_550 = (pointer)uVar37;
              local_560->_M_local_buf[uVar37] = '\0';
              tcu::ResultCollector::fail(local_640,(string *)local_558);
              if (local_558 != (undefined1  [8])&local_548) {
                operator_delete((void *)local_558,(ulong)(local_548._M_allocated_capacity + 1));
              }
            }
            else {
              local_558 = (undefined1  [8])paVar11;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&pHStack_550,
                         "\tNote: Image PresentID 80 was expected to be late by approximately 1 second."
                         ,0x4c);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
              std::ios_base::~ios_base(local_4e0);
            }
          }
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t   actualPresentTime = ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t - desiredPresentTime= ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t =========================================",0x2c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t   diff              =       ",0x1f);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t - refreshDuration   =       ",0x1f);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t =========================================",0x2c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t   diff              =        ",0x20);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          bVar40 = true;
        }
        else if ((*(ulong *)(local_698._0_8_ + 0x18 + lVar45) < uVar19) &&
                ("CaseINS0_9SignatureIN3tcu6MatrixIfLi4ELi3EEES5_S5_NS0_4VoidES6_EEEC2ERKNS0_11CaseContextERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEERKNS0_4FuncIS7_EE"
                 <= *(char **)(local_698._0_8_ + 0x20 + lVar45))) {
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"Image PresentID ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550," can be presented ",0x12);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550," nsec earlier.",0xe);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t   actualPresentTime = ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t -earliestPresentTime= ",0x19);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t =========================================",0x2c);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          std::ios_base::~ios_base(local_4e0);
          local_558 = (undefined1  [8])paVar11;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&pHStack_550,"\t\t   diff              =        ",0x20);
          std::ostream::_M_insert<unsigned_long>((ulong)&pHStack_550);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pHStack_550," nsec",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
          uVar37 = std::ios_base::~ios_base(local_4e0);
          local_658 = (vector<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
                       *)CONCAT71((int7)((ulong)uVar37 >> 8),1);
        }
      }
      uVar44 = uVar44 + 1;
      lVar45 = lVar45 + 0x28;
      pvVar38 = local_658;
    } while (uVar44 < (ulong)(((long)(local_698._8_8_ - local_698._0_8_) >> 3) * -0x3333333333333333
                             ));
  }
  if (bVar40) {
    uVar44 = this->m_refreshDurationMultiplier + 1;
    this->m_refreshDurationMultiplier = uVar44;
    if (uVar44 < 3) {
      local_558 = (undefined1  [8])paVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pHStack_550,"Increasing multiplier.",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00741ace:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pHStack_550);
      std::ios_base::~ios_base(local_4e0);
    }
    else {
      this->m_refreshDurationMultiplier = 2;
    }
  }
  else if (((ulong)pvVar38 & 1) != 0) {
    pdVar4 = &this->m_refreshDurationMultiplier;
    *pdVar4 = *pdVar4 - 1;
    if (*pdVar4 != 0) {
      local_558 = (undefined1  [8])paVar11;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pHStack_550);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pHStack_550,"Decreasing multiplier.",0x16);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_558,(EndMessageToken *)&tcu::TestLog::EndMessage);
      goto LAB_00741ace;
    }
    this->m_refreshDurationMultiplier = 1;
  }
  this->m_targetIPD = this->m_refreshDurationMultiplier * (this->m_rcDuration).refreshDuration;
  if ((void *)local_698._0_8_ != (void *)0x0) {
    operator_delete((void *)local_698._0_8_,(long)local_688 - local_698._0_8_);
  }
LAB_00741b21:
  local_638._0_4_ = 0x400;
  local_388._0_4_ = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  local_388._8_8_ = (DeviceInterface *)0x0;
  local_378.m_internal._0_4_ = 1;
  VStack_370.m_internal = (deUint64)&local_148;
  pVStack_360 = (VkPipelineInputAssemblyStateCreateInfo *)CONCAT44(pVStack_360._4_4_,1);
  ppVVar12 = (this->m_commandBuffers).
             super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_358 = (VkExtent2D)
              (ppVVar12 +
              this->m_frameNdx %
              (ulong)((long)(this->m_commandBuffers).
                            super__Vector_base<vk::VkCommandBuffer_s_*,_std::allocator<vk::VkCommandBuffer_s_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12 >> 3));
  pVStack_350 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(pVStack_350._4_4_,1);
  local_368 = (VkPipelineColorBlendStateCreateInfo *)local_638;
  local_348 = (VkPipelineRasterizationStateCreateInfo *)&local_118;
  VVar32 = ::vk::DeviceDriver::queueSubmit
                     (pDVar2,this->m_queue,1,(VkSubmitInfo *)local_388,(VkFence)0x0);
  ::vk::checkResult(VVar32,"m_vkd.queueSubmit(m_queue, 1u, &submitInfo, (vk::VkFence)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                    ,0x4ba);
  if (this->m_useDisplayTiming == true) {
    dVar33 = this->m_nextPresentID + 1;
    this->m_nextPresentID = dVar33;
    local_5c8._0_4_ = dVar33;
    local_5c8._8_8_ = this->m_prevDesiredPresentTime;
    dVar39 = deGetMicroseconds();
    pmVar35 = std::
              map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
              ::operator[](&this->m_queuePresentTimes,&this->m_nextPresentID);
    mVar43 = dVar39 * 1000;
    *pmVar35 = mVar43;
    if (this->m_prevDesiredPresentTime == 0) {
      if (mVar43 == 0) {
        local_5c8._8_8_ = (DeviceInterface *)0x0;
        dVar39 = 0;
      }
      else {
        local_5c8._8_8_ = (this->m_targetIPD >> 1) + mVar43;
        dVar39 = 0;
      }
    }
    else {
      dVar39 = this->m_prevDesiredPresentTime + this->m_targetIPD;
      if (local_5c8._0_4_ == 0x50) {
        local_5c8._8_8_ = local_5c8._8_8_ + -1000000000;
        this->m_ExpectImage80Late = true;
      }
    }
    pVStack_350 = (VkPipelineVertexInputStateCreateInfo *)local_698;
    pVStack_620 = (VkPipelineShaderStageCreateInfo *)local_5c8;
    local_358 = (VkExtent2D)&local_1b0;
    this->m_prevDesiredPresentTime = dVar39;
    local_638._0_4_ = VK_STRUCTURE_TYPE_PRESENT_TIMES_INFO_GOOGLE;
    local_638._8_8_ = (DeviceInterface *)0x0;
    local_628 = (VkDevice)CONCAT44(local_628._4_4_,1);
    local_388._0_4_ = 0x3b9acde9;
    local_378.m_internal._0_4_ = 1;
    local_368 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(local_368._4_4_,1);
    local_388._8_8_ = (VkPipelineVertexInputStateCreateInfo *)local_638;
    VStack_370.m_internal = (deUint64)&local_118;
    pVStack_360 = (VkPipelineInputAssemblyStateCreateInfo *)&this->m_swapchain;
    VVar32 = ::vk::DeviceDriver::queuePresentKHR(pDVar2,this->m_queue,(VkPresentInfoKHR *)local_388)
    ;
    ::vk::checkResult(VVar32,"m_vkd.queuePresentKHR(m_queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x4fd);
    ::vk::checkResult(local_698._0_4_,"result",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x4fe);
  }
  else {
    local_388._0_4_ = 0x3b9acde9;
    local_388._8_8_ = (VkPipelineVertexInputStateCreateInfo *)0x0;
    local_378.m_internal._0_4_ = 1;
    local_368 = (VkPipelineColorBlendStateCreateInfo *)CONCAT44(local_368._4_4_,1);
    local_358 = (VkExtent2D)&local_1b0;
    VStack_370.m_internal = (deUint64)&local_118;
    pVStack_360 = (VkPipelineInputAssemblyStateCreateInfo *)&this->m_swapchain;
    pVStack_350 = (VkPipelineVertexInputStateCreateInfo *)local_638;
    VVar32 = ::vk::DeviceDriver::queuePresentKHR(pDVar2,this->m_queue,(VkPresentInfoKHR *)local_388)
    ;
    ::vk::checkResult(VVar32,"m_vkd.queuePresentKHR(m_queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x50f);
    ::vk::checkResult(local_638._0_4_,"result",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiDisplayTimingTests.cpp"
                      ,0x510);
  }
  pTVar25 = local_650;
  uVar44 = (ulong)local_1b0.sType;
  pHVar21 = (this->m_acquireSemaphores).
            super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->m_freeAcquireSemaphore).m_internal = pHVar21[uVar44].m_internal;
  pHVar21[uVar44].m_internal = local_148._0_8_;
  pHVar21 = (this->m_renderSemaphores).
            super__Vector_base<vk::Handle<(vk::HandleType)4>,_std::allocator<vk::Handle<(vk::HandleType)4>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  (this->m_freeRenderSemaphore).m_internal = pHVar21[uVar44].m_internal;
  pHVar21[uVar44].m_internal = local_118.m_internal;
  uVar44 = this->m_frameNdx + 1;
  this->m_frameNdx = uVar44;
  if (uVar44 < this->m_frameCount) {
    tcu::TestStatus::incomplete();
  }
  else {
    deinitSwapchainResources(this);
    qVar34 = tcu::ResultCollector::getResult(&this->m_resultCollector);
    pcVar22 = (this->m_resultCollector).m_message._M_dataplus._M_p;
    local_558 = (undefined1  [8])&local_548;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_558,pcVar22,
               pcVar22 + (this->m_resultCollector).m_message._M_string_length);
    pTVar25->m_code = qVar34;
    (pTVar25->m_description)._M_dataplus._M_p = (pointer)&(pTVar25->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar25->m_description,local_558,
               (pointer)((long)&pHStack_550->m_internal + (long)local_558));
    if (local_558 != (undefined1  [8])&local_548) {
      operator_delete((void *)local_558,(ulong)(local_548._M_allocated_capacity + 1));
    }
  }
  return pTVar25;
}

Assistant:

tcu::TestStatus DisplayTimingTestInstance::iterate (void)
{
	// Initialize swapchain specific resources
	// Render test
	try
	{
		if (m_frameNdx == 0)
		{
			if (m_outOfDateCount == 0)
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Swapchain: " << m_swapchainConfig << tcu::TestLog::EndMessage;

			initSwapchainResources();
		}

		render();
	}
	catch (const vk::Error& error)
	{
		if (error.getError() == vk::VK_ERROR_OUT_OF_DATE_KHR)
		{
			if (m_outOfDateCount < m_maxOutOfDateCount)
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Frame " << m_frameNdx << ": Swapchain out of date. Recreating resources." << TestLog::EndMessage;
				deinitSwapchainResources();
				m_frameNdx = 0;
				m_outOfDateCount++;

				return tcu::TestStatus::incomplete();
			}
			else
			{
				m_context.getTestContext().getLog() << TestLog::Message << "Frame " << m_frameNdx << ": Swapchain out of date." << TestLog::EndMessage;
				m_resultCollector.fail("Received too many VK_ERROR_OUT_OF_DATE_KHR errors. Received " + de::toString(m_outOfDateCount) + ", max " + de::toString(m_maxOutOfDateCount));
			}
		}
		else
		{
			m_resultCollector.fail(error.what());
		}

		deinitSwapchainResources();

		return tcu::TestStatus(m_resultCollector.getResult(), m_resultCollector.getMessage());
	}

	m_frameNdx++;

	if (m_frameNdx >= m_frameCount)
	{
		deinitSwapchainResources();

		return tcu::TestStatus(m_resultCollector.getResult(), m_resultCollector.getMessage());
	}
	else
		return tcu::TestStatus::incomplete();
}